

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringUtils.cpp
# Opt level: O3

string * Lib::StringUtils::sanitizeSuffix(string *__return_storage_ptr__,string *str)

{
  size_t s;
  pointer pcVar1;
  char *pcVar2;
  char *pcVar3;
  long lVar4;
  byte bVar5;
  ulong uVar6;
  
  s = str->_M_string_length;
  if (sanitizeSuffix(std::__cxx11::string)::buf == '\0') {
    sanitizeSuffix();
  }
  DArray<char>::ensure(&sanitizeSuffix::buf,s);
  pcVar2 = sanitizeSuffix::buf._array;
  pcVar1 = (str->_M_dataplus)._M_p;
  lVar4 = 0;
  do {
    pcVar3 = sanitizeSuffix::buf._array;
    bVar5 = pcVar1[lVar4];
    uVar6 = (ulong)bVar5;
    if (uVar6 < 0x2f) {
      if ((0x53b400000000U >> (uVar6 & 0x3f) & 1) == 0) {
        if (uVar6 == 0) {
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)__return_storage_ptr__,pcVar3,pcVar3 + s);
          return __return_storage_ptr__;
        }
      }
      else {
        bVar5 = 0x5f;
      }
    }
    pcVar2[lVar4] = bVar5;
    lVar4 = lVar4 + 1;
  } while( true );
}

Assistant:

std::string StringUtils::sanitizeSuffix(std::string str)
{
  size_t len=str.size();
  static DArray<char> buf;
  buf.ensure(len);

  const char* sptr=str.c_str();
  char* tptr=buf.array();

  while(*sptr) {
    char c = *sptr;

    switch(c) {
    case '(':
    case ')':
    case '"':
    case '\'':
    case '$':
    case '%':
    case ',':
    case '.':
      c = '_';
      break;
    default: break;
    }

    *tptr = c;
    tptr++;
    sptr++;
  }
  return std::string(buf.array(), len);
}